

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CWhileStm *stm)

{
  initializer_list<INode_*> __l;
  allocator local_d1;
  string local_d0 [32];
  vector<INode_*,_std::allocator<INode_*>_> local_b0;
  ChildrenAnswers local_98;
  allocator<INode_*> local_51;
  pointer local_50;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CWhileStm *stm_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)stm;
  local_50 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get
                       (&stm->conditionExpression);
  local_48 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::get
                       ((unique_ptr<IStatement,_std::default_delete<IStatement>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  local_40 = &local_50;
  local_38 = 2;
  std::allocator<INode_*>::allocator(&local_51);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_51);
  std::allocator<INode_*>::~allocator(&local_51);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_b0,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren(&local_98,this,&local_b0);
  AddChildrenAnswers(this,&local_98);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&local_98);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"WhileStm",&local_d1);
  AddLabel(this,(string *)local_d0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  this->lastVisited = this->lastVisited + 1;
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CWhileStm &stm) {
	std::vector<INode*> children = { stm.conditionExpression.get(), stm.statement.get() };
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("WhileStm");
	++lastVisited;
}